

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_serialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  t_struct *ptVar1;
  ostream *poVar2;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar2 = std::operator<<(out,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,"if err := ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::operator<<(poVar2,(string *)&this->write_method_name_);
  poVar2 = std::operator<<(poVar2,"(ctx, oprot); err != nil {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_78,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)ptVar1,(string *)&local_78);
  poVar2 = std::operator<<(poVar2,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", "
                          );
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"), err)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_78);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)ptVar1,(string *)&local_98);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void t_go_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  (void)tstruct;
  out << indent() << "if err := " << prefix << "." << write_method_name_ << "(ctx, oprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}